

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

size_t ht_key_to_string(HTKeyType type,HTItemKey key,char **dest)

{
  long lVar1;
  char *pcVar2;
  void *__dest;
  char *__s;
  char *string_2;
  size_t size_1;
  char *string_1;
  char *string;
  size_t size;
  char **dest_local;
  HTKeyType type_local;
  HTItemKey key_local;
  
  key_local.field_0.ident_length = key.field_0.ident_length;
  __s = key.field_0.key_ident_string;
  switch(type) {
  case HT_KEY_OBJSTRING:
    lVar1 = *(long *)(__s + 0x10);
    pcVar2 = (char *)malloc(lVar1 + 1);
    memcpy(pcVar2,*(void **)(__s + 0x18),*(size_t *)(__s + 0x10));
    pcVar2[lVar1] = '\0';
    *dest = pcVar2;
    key_local._8_8_ = __s[0x10];
    break;
  case HT_KEY_CSTRING:
    pcVar2 = strdup(__s);
    *dest = pcVar2;
    key_local.field_0.ident_length = strlen(__s);
    break;
  case HT_KEY_INT:
    pcVar2 = (char *)malloc(0xb);
    sprintf(pcVar2,"%d",(ulong)__s & 0xffffffff);
    *dest = pcVar2;
    key_local.field_0.ident_length = strlen(pcVar2);
    break;
  case HT_KEY_IDENT_STRING:
    __dest = malloc(key_local.field_0.ident_length + 1);
    memcpy(__dest,__s,key_local.field_0.ident_length);
    *(undefined1 *)((long)__dest + key_local.field_0.ident_length) = 0;
    break;
  default:
    key_local.field_0.ident_length = 0;
  }
  return key_local.field_0.ident_length;
}

Assistant:

static size_t ht_key_to_string(HTKeyType type, HTItemKey key, char **dest) {
    switch (type) {
        case HT_KEY_CSTRING:
            *dest = strdup(key.key_c_string);
            return strlen(key.key_c_string);
        case HT_KEY_OBJSTRING: {
            size_t size = (key.key_obj_string->length + 1) * sizeof(char);
            char *string = malloc(size);
            memcpy(string, key.key_obj_string->start, key.key_obj_string->length);
            string[size - 1] = '\0';
            *dest = string;
            return key.key_obj_string->length;
        }
        case HT_KEY_INT: {
            // all numbers represented by a 32 bit unsigned integer fit into 10 bytes
            char *string = malloc(11 * sizeof(char));
            sprintf(string, "%d", key.key_int);
            *dest = string;
            return strlen(string);
        }
        case HT_KEY_IDENT_STRING: {
            size_t size = (key.ident_length + 1) * sizeof(char);
            char *string = malloc(size);
            memcpy(string, key.key_ident_string, key.ident_length);
            string[size - 1] = '\0';
            return key.ident_length;
        }
    }

    return 0;
}